

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakebl.c
# Opt level: O2

int setup_dir(void)

{
  char *__s;
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  char *__dest_00;
  FILE *__stream;
  
  uVar1 = mkdir(path,0x1ed);
  __s = path;
  sVar3 = strlen(path);
  __dest = (char *)malloc(sVar3 + 0xc);
  brpath = __dest;
  sVar3 = strlen(__s);
  __dest_00 = (char *)malloc(sVar3 + 0x10);
  mbrpath = __dest_00;
  strcpy(__dest,__s);
  strcpy(__dest_00,__s);
  sVar3 = strlen(__dest);
  builtin_strncpy(__dest + sVar3,"/brightness",0xc);
  sVar3 = strlen(__dest_00);
  builtin_strncpy(__dest_00 + sVar3,"/max_brightness",0x10);
  uVar2 = mkfifo(__dest,0x1b6);
  __stream = fopen(mbrpath,"w");
  if (__stream != (FILE *)0x0) {
    fputs("100\n",__stream);
  }
  fclose(__stream);
  return (uint)(__stream == (FILE *)0x0) | uVar2 | uVar1;
}

Assistant:

int setup_dir()
{
	int r=mkdir(path,0755);
	brpath=malloc(strlen(path)+12);
	mbrpath=malloc(strlen(path)+16);
	strcpy(brpath,path);
	strcpy(mbrpath,path);
	strcat(brpath,"/brightness");
	strcat(mbrpath,"/max_brightness");
	r|=mkfifo(brpath,0666);
	FILE* mbrf=fopen(mbrpath,"w");
	r|=(mbrf==NULL);
	if(mbrf)fputs("100\n",mbrf);
	fclose(mbrf);
	return r;
}